

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  void *pvVar1;
  CVodeProjMem pCVar2;
  int in_EDX;
  FILE *in_RSI;
  CVodeMem in_RDI;
  int is;
  CVodeProjMem cvproj_mem;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  uint local_3c;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x9e1,"CVodePrintAllStats",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_EDX == 0) {
      fprintf(in_RSI,"Current time                 = %.16g\n",in_RDI->cv_tn);
      fprintf(in_RSI,"Steps                        = %ld\n",in_RDI->cv_nst);
      fprintf(in_RSI,"Error test fails             = %ld\n",in_RDI->cv_netf);
      fprintf(in_RSI,"NLS step fails               = %ld\n",in_RDI->cv_ncfn);
      fprintf(in_RSI,"Initial step size            = %.16g\n",in_RDI->cv_h0u);
      fprintf(in_RSI,"Last step size               = %.16g\n",in_RDI->cv_hu);
      fprintf(in_RSI,"Current step size            = %.16g\n",in_RDI->cv_next_h);
      fprintf(in_RSI,"Last method order            = %d\n",(ulong)(uint)in_RDI->cv_qu);
      fprintf(in_RSI,"Current method order         = %d\n",(ulong)(uint)in_RDI->cv_next_q);
      fprintf(in_RSI,"Stab. lim. order reductions  = %ld\n",in_RDI->cv_nor);
      fprintf(in_RSI,"RHS fn evals                 = %ld\n",in_RDI->cv_nfe);
      fprintf(in_RSI,"NLS iters                    = %ld\n",in_RDI->cv_nni);
      fprintf(in_RSI,"NLS fails                    = %ld\n",in_RDI->cv_nnf);
      if (0 < in_RDI->cv_nst) {
        fprintf(in_RSI,"NLS iters per step           = %.16g\n",
                (double)in_RDI->cv_nni / (double)in_RDI->cv_nst);
      }
      fprintf(in_RSI,"LS setups                    = %ld\n",in_RDI->cv_nsetups);
      if (in_RDI->cv_lmem != (void *)0x0) {
        pvVar1 = in_RDI->cv_lmem;
        fprintf(in_RSI,"Jac fn evals                 = %ld\n",*(undefined8 *)((long)pvVar1 + 0x88));
        fprintf(in_RSI,"LS RHS fn evals              = %ld\n",*(undefined8 *)((long)pvVar1 + 0x90));
        fprintf(in_RSI,"Prec setup evals             = %ld\n",*(undefined8 *)((long)pvVar1 + 0xa0));
        fprintf(in_RSI,"Prec solves                  = %ld\n",*(undefined8 *)((long)pvVar1 + 0xb0));
        fprintf(in_RSI,"LS iters                     = %ld\n",*(undefined8 *)((long)pvVar1 + 0xa8));
        fprintf(in_RSI,"LS fails                     = %ld\n",*(undefined8 *)((long)pvVar1 + 0xb8));
        fprintf(in_RSI,"Jac-times setups             = %ld\n",*(undefined8 *)((long)pvVar1 + 0xc0));
        fprintf(in_RSI,"Jac-times evals              = %ld\n",*(undefined8 *)((long)pvVar1 + 200));
        if (0 < in_RDI->cv_nni) {
          fprintf(in_RSI,"LS iters per NLS iter        = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0xa8) / (double)in_RDI->cv_nni);
          fprintf(in_RSI,"Jac evals per NLS iter       = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0x88) / (double)in_RDI->cv_nni);
          fprintf(in_RSI,"Prec evals per NLS iter      = %.16g\n",
                  (double)*(long *)((long)pvVar1 + 0xa0) / (double)in_RDI->cv_nni);
        }
      }
      fprintf(in_RSI,"Root fn evals                = %ld\n",in_RDI->cv_nge);
      if (in_RDI->proj_mem != (CVodeProjMem)0x0) {
        pCVar2 = in_RDI->proj_mem;
        fprintf(in_RSI,"Projection fn evals          = %ld\n",pCVar2->nproj);
        fprintf(in_RSI,"Projection fails             = %ld\n",pCVar2->npfails);
      }
      if (in_RDI->cv_quadr != 0) {
        fprintf(in_RSI,"Quad fn evals                = %ld\n",in_RDI->cv_nfQe);
        fprintf(in_RSI,"Quad error test fails        = %ld\n",in_RDI->cv_netfQ);
      }
      if (in_RDI->cv_sensi != 0) {
        fprintf(in_RSI,"Sens fn evals                = %ld\n",in_RDI->cv_nfSe);
        fprintf(in_RSI,"Sens RHS fn evals            = %ld\n",in_RDI->cv_nfeS);
        fprintf(in_RSI,"Sens error test fails        = %ld\n",in_RDI->cv_netfS);
        if (in_RDI->cv_ism != 1) {
          fprintf(in_RSI,"Sens NLS iters               = %ld\n",in_RDI->cv_nniS);
          fprintf(in_RSI,"Sens NLS fails               = %ld\n",in_RDI->cv_nnfS);
          fprintf(in_RSI,"Sens NLS step fails          = %ld\n",in_RDI->cv_ncfnS);
        }
        if (in_RDI->cv_ism == 3) {
          fprintf(in_RSI,"Sens stgr1 NLS iters         = %ld",*in_RDI->cv_nniS1);
          for (local_3c = 1; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,", %ld",in_RDI->cv_nniS1[(int)local_3c]);
          }
          fprintf(in_RSI,"\n");
          fprintf(in_RSI,"Sens stgr1 NLS fails         = %ld",*in_RDI->cv_nnfS1);
          for (local_3c = 1; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,", %ld",in_RDI->cv_nnfS1[(int)local_3c]);
          }
          fprintf(in_RSI,"\n");
          fprintf(in_RSI,"Sens stgr1 NLS step fails    = %ld",*in_RDI->cv_ncfnS1);
          for (local_3c = 1; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,", %ld",in_RDI->cv_ncfnS1[(int)local_3c]);
          }
          fprintf(in_RSI,"\n");
        }
        fprintf(in_RSI,"Sens LS setups               = %ld\n",in_RDI->cv_nsetupsS);
      }
      if (in_RDI->cv_quadr_sensi != 0) {
        fprintf(in_RSI,"QuadSens fn evals            = %ld\n",in_RDI->cv_nfQSe);
        fprintf(in_RSI,"QuadSens error test fails    = %ld\n",in_RDI->cv_netfQS);
      }
    }
    else {
      if (in_EDX != 1) {
        cvProcessError(in_RDI,-0x16,0xad6,"CVodePrintAllStats",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                       ,"Invalid formatting option.");
        return -0x16;
      }
      fprintf(in_RSI,"Time,%.16g",in_RDI->cv_tn);
      fprintf(in_RSI,",Steps,%ld",in_RDI->cv_nst);
      fprintf(in_RSI,",Error test fails,%ld",in_RDI->cv_netf);
      fprintf(in_RSI,",NLS step fails,%ld",in_RDI->cv_ncfn);
      fprintf(in_RSI,",Initial step size,%.16g",in_RDI->cv_h0u);
      fprintf(in_RSI,",Last step size,%.16g",in_RDI->cv_hu);
      fprintf(in_RSI,",Current step size,%.16g",in_RDI->cv_next_h);
      fprintf(in_RSI,",Last method order,%d",(ulong)(uint)in_RDI->cv_qu);
      fprintf(in_RSI,",Current method order,%d",(ulong)(uint)in_RDI->cv_next_q);
      fprintf(in_RSI,",Stab. lim. order reductions,%ld",in_RDI->cv_nor);
      fprintf(in_RSI,",RHS fn evals,%ld",in_RDI->cv_nfe);
      fprintf(in_RSI,",NLS iters,%ld",in_RDI->cv_nni);
      fprintf(in_RSI,",NLS fails,%ld",in_RDI->cv_nnf);
      if (in_RDI->cv_nst < 1) {
        fprintf(in_RSI,",NLS iters per step,0");
      }
      else {
        fprintf(in_RSI,",NLS iters per step,%.16g",(double)in_RDI->cv_nni / (double)in_RDI->cv_nst);
      }
      fprintf(in_RSI,",LS setups,%ld",in_RDI->cv_nsetups);
      if (in_RDI->cv_lmem != (void *)0x0) {
        pvVar1 = in_RDI->cv_lmem;
        fprintf(in_RSI,",Jac fn evals,%ld",*(undefined8 *)((long)pvVar1 + 0x88));
        fprintf(in_RSI,",LS RHS fn evals,%ld",*(undefined8 *)((long)pvVar1 + 0x90));
        fprintf(in_RSI,",Prec setup evals,%ld",*(undefined8 *)((long)pvVar1 + 0xa0));
        fprintf(in_RSI,",Prec solves,%ld",*(undefined8 *)((long)pvVar1 + 0xb0));
        fprintf(in_RSI,",LS iters,%ld",*(undefined8 *)((long)pvVar1 + 0xa8));
        fprintf(in_RSI,",LS fails,%ld",*(undefined8 *)((long)pvVar1 + 0xb8));
        fprintf(in_RSI,",Jac-times setups,%ld",*(undefined8 *)((long)pvVar1 + 0xc0));
        fprintf(in_RSI,",Jac-times evals,%ld",*(undefined8 *)((long)pvVar1 + 200));
        if (in_RDI->cv_nni < 1) {
          fprintf(in_RSI,",LS iters per NLS iter,0");
          fprintf(in_RSI,",Jac evals per NLS iter,0");
          fprintf(in_RSI,",Prec evals per NLS iter,0");
        }
        else {
          fprintf(in_RSI,",LS iters per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0xa8) / (double)in_RDI->cv_nni);
          fprintf(in_RSI,",Jac evals per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0x88) / (double)in_RDI->cv_nni);
          fprintf(in_RSI,",Prec evals per NLS iter,%.16g",
                  (double)*(long *)((long)pvVar1 + 0xa0) / (double)in_RDI->cv_nni);
        }
      }
      fprintf(in_RSI,",Root fn evals,%ld",in_RDI->cv_nge);
      if (in_RDI->proj_mem != (CVodeProjMem)0x0) {
        pCVar2 = in_RDI->proj_mem;
        fprintf(in_RSI,",Projection fn evals,%ld",pCVar2->nproj);
        fprintf(in_RSI,",Projection fails,%ld",pCVar2->npfails);
      }
      if (in_RDI->cv_quadr != 0) {
        fprintf(in_RSI,",Quad fn evals,%ld",in_RDI->cv_nfQe);
        fprintf(in_RSI,",Quad error test fails,%ld",in_RDI->cv_netfQ);
      }
      if (in_RDI->cv_sensi != 0) {
        fprintf(in_RSI,",Sens fn evals,%ld",in_RDI->cv_nfSe);
        fprintf(in_RSI,",Sens RHS fn evals,%ld",in_RDI->cv_nfeS);
        fprintf(in_RSI,",Sens error test fails,%ld",in_RDI->cv_netfS);
        if (in_RDI->cv_ism != 1) {
          fprintf(in_RSI,",Sens NLS iters,%ld",in_RDI->cv_nniS);
          fprintf(in_RSI,",Sens NLS fails,%ld",in_RDI->cv_nnfS);
          fprintf(in_RSI,",Sens NLS step fails,%ld",in_RDI->cv_ncfnS);
        }
        if (in_RDI->cv_ism == 3) {
          for (local_3c = 0; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,",Sens stgr1[%i] NLS iters,%ld",(ulong)local_3c,
                    in_RDI->cv_nniS1[(int)local_3c]);
          }
          for (local_3c = 0; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,",Sens stgr1[%i] NLS fails,%ld",(ulong)local_3c,
                    in_RDI->cv_nnfS1[(int)local_3c]);
          }
          for (local_3c = 0; (int)local_3c < in_RDI->cv_Ns; local_3c = local_3c + 1) {
            fprintf(in_RSI,",Sens stgr1[%i] NLS step fails,%ld",(ulong)local_3c,
                    in_RDI->cv_ncfnS1[(int)local_3c]);
          }
        }
        fprintf(in_RSI,",Sens LS setups,%ld",in_RDI->cv_nsetupsS);
      }
      if (in_RDI->cv_quadr_sensi != 0) {
        fprintf(in_RSI,",QuadSens fn evals,%ld",in_RDI->cv_nfQSe);
        fprintf(in_RSI,",QuadSens error test fails,%ld",in_RDI->cv_netfQS);
      }
      fprintf(in_RSI,"\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodePrintAllStats(void* cvode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;
  int is;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  switch (fmt)
  {
  case SUN_OUTPUTFORMAT_TABLE:
    /* step and method stats */
    fprintf(outfile, "Current time                 = %" RSYM "\n", cv_mem->cv_tn);
    fprintf(outfile, "Steps                        = %ld\n", cv_mem->cv_nst);
    fprintf(outfile, "Error test fails             = %ld\n", cv_mem->cv_netf);
    fprintf(outfile, "NLS step fails               = %ld\n", cv_mem->cv_ncfn);
    fprintf(outfile, "Initial step size            = %" RSYM "\n",
            cv_mem->cv_h0u);
    fprintf(outfile, "Last step size               = %" RSYM "\n", cv_mem->cv_hu);
    fprintf(outfile, "Current step size            = %" RSYM "\n",
            cv_mem->cv_next_h);
    fprintf(outfile, "Last method order            = %d\n", cv_mem->cv_qu);
    fprintf(outfile, "Current method order         = %d\n", cv_mem->cv_next_q);
    fprintf(outfile, "Stab. lim. order reductions  = %ld\n", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, "RHS fn evals                 = %ld\n", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, "NLS iters                    = %ld\n", cv_mem->cv_nni);
    fprintf(outfile, "NLS fails                    = %ld\n", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, "NLS iters per step           = %" RSYM "\n",
              (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
    }

    /* linear solver stats */
    fprintf(outfile, "LS setups                    = %ld\n", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
      fprintf(outfile, "Jac fn evals                 = %ld\n", cvls_mem->nje);
      fprintf(outfile, "LS RHS fn evals              = %ld\n", cvls_mem->nfeDQ);
      fprintf(outfile, "Prec setup evals             = %ld\n", cvls_mem->npe);
      fprintf(outfile, "Prec solves                  = %ld\n", cvls_mem->nps);
      fprintf(outfile, "LS iters                     = %ld\n", cvls_mem->nli);
      fprintf(outfile, "LS fails                     = %ld\n", cvls_mem->ncfl);
      fprintf(outfile, "Jac-times setups             = %ld\n",
              cvls_mem->njtsetup);
      fprintf(outfile, "Jac-times evals              = %ld\n", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, "LS iters per NLS iter        = %" RSYM "\n",
                (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, "Jac evals per NLS iter       = %" RSYM "\n",
                (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, "Prec evals per NLS iter      = %" RSYM "\n",
                (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
      }
    }

    /* rootfinding stats */
    fprintf(outfile, "Root fn evals                = %ld\n", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
      fprintf(outfile, "Projection fn evals          = %ld\n", cvproj_mem->nproj);
      fprintf(outfile, "Projection fails             = %ld\n",
              cvproj_mem->npfails);
    }

    /* quadrature stats */
    if (cv_mem->cv_quadr)
    {
      fprintf(outfile, "Quad fn evals                = %ld\n", cv_mem->cv_nfQe);
      fprintf(outfile, "Quad error test fails        = %ld\n", cv_mem->cv_netfQ);
    }

    /* sensitivity stats */
    if (cv_mem->cv_sensi)
    {
      fprintf(outfile, "Sens fn evals                = %ld\n", cv_mem->cv_nfSe);
      fprintf(outfile, "Sens RHS fn evals            = %ld\n", cv_mem->cv_nfeS);
      fprintf(outfile, "Sens error test fails        = %ld\n", cv_mem->cv_netfS);
      if (cv_mem->cv_ism != CV_SIMULTANEOUS)
      {
        fprintf(outfile, "Sens NLS iters               = %ld\n", cv_mem->cv_nniS);
        fprintf(outfile, "Sens NLS fails               = %ld\n", cv_mem->cv_nnfS);
        fprintf(outfile, "Sens NLS step fails          = %ld\n",
                cv_mem->cv_ncfnS);
      }
      if (cv_mem->cv_ism == CV_STAGGERED1)
      {
        fprintf(outfile, "Sens stgr1 NLS iters         = %ld",
                cv_mem->cv_nniS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_nniS1[is]);
        }
        fprintf(outfile, "\n");
        fprintf(outfile, "Sens stgr1 NLS fails         = %ld",
                cv_mem->cv_nnfS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_nnfS1[is]);
        }
        fprintf(outfile, "\n");
        fprintf(outfile, "Sens stgr1 NLS step fails    = %ld",
                cv_mem->cv_ncfnS1[0]);
        for (is = 1; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ", %ld", cv_mem->cv_ncfnS1[is]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "Sens LS setups               = %ld\n",
              cv_mem->cv_nsetupsS);
    }

    /* quadrature-sensitivity stats */
    if (cv_mem->cv_quadr_sensi)
    {
      fprintf(outfile, "QuadSens fn evals            = %ld\n", cv_mem->cv_nfQSe);
      fprintf(outfile, "QuadSens error test fails    = %ld\n", cv_mem->cv_netfQS);
    }
    break;

  case SUN_OUTPUTFORMAT_CSV:
    /* step and method stats */
    fprintf(outfile, "Time,%" RSYM, cv_mem->cv_tn);
    fprintf(outfile, ",Steps,%ld", cv_mem->cv_nst);
    fprintf(outfile, ",Error test fails,%ld", cv_mem->cv_netf);
    fprintf(outfile, ",NLS step fails,%ld", cv_mem->cv_ncfn);
    fprintf(outfile, ",Initial step size,%" RSYM, cv_mem->cv_h0u);
    fprintf(outfile, ",Last step size,%" RSYM, cv_mem->cv_hu);
    fprintf(outfile, ",Current step size,%" RSYM, cv_mem->cv_next_h);
    fprintf(outfile, ",Last method order,%d", cv_mem->cv_qu);
    fprintf(outfile, ",Current method order,%d", cv_mem->cv_next_q);
    fprintf(outfile, ",Stab. lim. order reductions,%ld", cv_mem->cv_nor);

    /* function evaluations */
    fprintf(outfile, ",RHS fn evals,%ld", cv_mem->cv_nfe);

    /* nonlinear solver stats */
    fprintf(outfile, ",NLS iters,%ld", cv_mem->cv_nni);
    fprintf(outfile, ",NLS fails,%ld", cv_mem->cv_nnf);
    if (cv_mem->cv_nst > 0)
    {
      fprintf(outfile, ",NLS iters per step,%" RSYM,
              (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
    }
    else { fprintf(outfile, ",NLS iters per step,0"); }

    /* linear solver stats */
    fprintf(outfile, ",LS setups,%ld", cv_mem->cv_nsetups);
    if (cv_mem->cv_lmem)
    {
      cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
      fprintf(outfile, ",Jac fn evals,%ld", cvls_mem->nje);
      fprintf(outfile, ",LS RHS fn evals,%ld", cvls_mem->nfeDQ);
      fprintf(outfile, ",Prec setup evals,%ld", cvls_mem->npe);
      fprintf(outfile, ",Prec solves,%ld", cvls_mem->nps);
      fprintf(outfile, ",LS iters,%ld", cvls_mem->nli);
      fprintf(outfile, ",LS fails,%ld", cvls_mem->ncfl);
      fprintf(outfile, ",Jac-times setups,%ld", cvls_mem->njtsetup);
      fprintf(outfile, ",Jac-times evals,%ld", cvls_mem->njtimes);
      if (cv_mem->cv_nni > 0)
      {
        fprintf(outfile, ",LS iters per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, ",Jac evals per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
        fprintf(outfile, ",Prec evals per NLS iter,%" RSYM,
                (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
      }
      else
      {
        fprintf(outfile, ",LS iters per NLS iter,0");
        fprintf(outfile, ",Jac evals per NLS iter,0");
        fprintf(outfile, ",Prec evals per NLS iter,0");
      }
    }

    /* rootfinding stats */
    fprintf(outfile, ",Root fn evals,%ld", cv_mem->cv_nge);

    /* projection stats */
    if (cv_mem->proj_mem)
    {
      cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
      fprintf(outfile, ",Projection fn evals,%ld", cvproj_mem->nproj);
      fprintf(outfile, ",Projection fails,%ld", cvproj_mem->npfails);
    }

    /* quadrature stats */
    if (cv_mem->cv_quadr)
    {
      fprintf(outfile, ",Quad fn evals,%ld", cv_mem->cv_nfQe);
      fprintf(outfile, ",Quad error test fails,%ld", cv_mem->cv_netfQ);
    }

    /* sensitivity stats */
    if (cv_mem->cv_sensi)
    {
      fprintf(outfile, ",Sens fn evals,%ld", cv_mem->cv_nfSe);
      fprintf(outfile, ",Sens RHS fn evals,%ld", cv_mem->cv_nfeS);
      fprintf(outfile, ",Sens error test fails,%ld", cv_mem->cv_netfS);
      if (cv_mem->cv_ism != CV_SIMULTANEOUS)
      {
        fprintf(outfile, ",Sens NLS iters,%ld", cv_mem->cv_nniS);
        fprintf(outfile, ",Sens NLS fails,%ld", cv_mem->cv_nnfS);
        fprintf(outfile, ",Sens NLS step fails,%ld", cv_mem->cv_ncfnS);
      }
      if (cv_mem->cv_ism == CV_STAGGERED1)
      {
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS iters,%ld", is,
                  cv_mem->cv_nniS1[is]);
        }
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS fails,%ld", is,
                  cv_mem->cv_nnfS1[is]);
        }
        for (is = 0; is < cv_mem->cv_Ns; is++)
        {
          fprintf(outfile, ",Sens stgr1[%i] NLS step fails,%ld", is,
                  cv_mem->cv_ncfnS1[is]);
        }
      }
      fprintf(outfile, ",Sens LS setups,%ld", cv_mem->cv_nsetupsS);
    }

    /* quadrature-sensitivity stats */
    if (cv_mem->cv_quadr_sensi)
    {
      fprintf(outfile, ",QuadSens fn evals,%ld", cv_mem->cv_nfQSe);
      fprintf(outfile, ",QuadSens error test fails,%ld", cv_mem->cv_netfQS);
    }
    fprintf(outfile, "\n");
    break;

  default:
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid formatting option.");
    return (CV_ILL_INPUT);
  }

  return (CV_SUCCESS);
}